

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::mapSkeletonMetacharacters
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          UnicodeString *patternForm,int32_t *flags,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  char16_t cVar4;
  char16_t cVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int offset;
  uint local_9c;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  sVar1 = (patternForm->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (patternForm->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  bVar2 = false;
  for (offset = 0; offset < iVar6; offset = offset + 1) {
    cVar4 = icu_63::UnicodeString::doCharAt(patternForm,offset);
    if (cVar4 == L'\'') {
      bVar2 = !bVar2;
    }
    else {
      bVar3 = !bVar2;
      bVar2 = true;
      if (bVar3) {
        if (cVar4 == L'j') {
LAB_002d5849:
          local_9c = 0;
          uVar7 = 0;
          while ((iVar8 = offset + 1, iVar8 < iVar6 &&
                 (cVar5 = icu_63::UnicodeString::doCharAt(patternForm,iVar8), cVar5 == cVar4))) {
            uVar7 = uVar7 + 1;
            local_9c = (uint)(byte)((char)local_9c + 1);
            offset = iVar8;
          }
          iVar8 = (uVar7 >> 1) + 3;
          if (uVar7 < 2) {
            iVar8 = 1;
          }
          if (cVar4 == L'j') {
            cVar4 = this->fDefaultHourFormatChar;
            cVar5 = L'a';
          }
          else {
            cVar4 = L'h';
            switch(this->fAllowedHourFormats[0]) {
            case 1:
            case 3:
            case 5:
              cVar4 = L'H';
            default:
              uVar7 = this->fAllowedHourFormats[0] & 0xfffffffe;
              cVar5 = L'B';
              if (uVar7 != 4) {
                cVar5 = (ushort)(uVar7 == 2) + L'a';
              }
              break;
            case -1:
              *status = U_INVALID_FORMAT_ERROR;
              (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
                   (_func_int **)&PTR__UnicodeString_00471e80;
              (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
              goto LAB_002d5998;
            }
          }
          if ((cVar4 == L'k') || (cVar4 == L'H')) {
            iVar8 = 0;
          }
          iVar8 = iVar8 + 1;
          while (iVar8 = iVar8 + -1, 0 < iVar8) {
            icu_63::UnicodeString::append(&local_70,cVar5);
          }
          uVar7 = local_9c & 1 | 2;
          while (uVar7 - 1 != 0 && 0 < (int)uVar7) {
            icu_63::UnicodeString::append(&local_70,cVar4);
            uVar7 = uVar7 - 1;
          }
        }
        else if (cVar4 == L'J') {
          icu_63::UnicodeString::append(&local_70,L'H');
          *(byte *)flags = (byte)*flags | 2;
        }
        else {
          if (cVar4 == L'C') goto LAB_002d5849;
          icu_63::UnicodeString::append(&local_70,cVar4);
        }
        bVar2 = false;
      }
    }
  }
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,&local_70);
LAB_002d5998:
  icu_63::UnicodeString::~UnicodeString(&local_70);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::mapSkeletonMetacharacters(const UnicodeString& patternForm, int32_t* flags, UErrorCode& status) {
    UnicodeString patternFormMapped;
    patternFormMapped.remove();
    UBool inQuoted = FALSE;
    int32_t patPos, patLen = patternForm.length();
    for (patPos = 0; patPos < patLen; patPos++) {
        UChar patChr = patternForm.charAt(patPos);
        if (patChr == SINGLE_QUOTE) {
            inQuoted = !inQuoted;
        } else if (!inQuoted) {
            // Handle special mappings for 'j' and 'C' in which fields lengths
            // 1,3,5 => hour field length 1
            // 2,4,6 => hour field length 2
            // 1,2 => abbreviated dayPeriod (field length 1..3)
            // 3,4 => long dayPeriod (field length 4)
            // 5,6 => narrow dayPeriod (field length 5)
            if (patChr == LOW_J || patChr == CAP_C) {
                int32_t extraLen = 0; // 1 less than total field length
                while (patPos+1 < patLen && patternForm.charAt(patPos+1)==patChr) {
                    extraLen++;
                    patPos++;
                }
                int32_t hourLen = 1 + (extraLen & 1);
                int32_t dayPeriodLen = (extraLen < 2)? 1: 3 + (extraLen >> 1);
                UChar hourChar = LOW_H;
                UChar dayPeriodChar = LOW_A;
                if (patChr == LOW_J) {
                    hourChar = fDefaultHourFormatChar;
                } else {
                    AllowedHourFormat preferred;
                    if (fAllowedHourFormats[0] != ALLOWED_HOUR_FORMAT_UNKNOWN) {
                        preferred = (AllowedHourFormat)fAllowedHourFormats[0];
                    } else {
                        status = U_INVALID_FORMAT_ERROR;
                        return UnicodeString();
                    }
                    if (preferred == ALLOWED_HOUR_FORMAT_H || preferred == ALLOWED_HOUR_FORMAT_HB || preferred == ALLOWED_HOUR_FORMAT_Hb) {
                        hourChar = CAP_H;
                    }
                    // in #13183 just add b/B to skeleton, no longer need to set special flags
                    if (preferred == ALLOWED_HOUR_FORMAT_HB || preferred == ALLOWED_HOUR_FORMAT_hB) {
                        dayPeriodChar = CAP_B;
                    } else if (preferred == ALLOWED_HOUR_FORMAT_Hb || preferred == ALLOWED_HOUR_FORMAT_hb) {
                        dayPeriodChar = LOW_B;
                    }
                }
                if (hourChar==CAP_H || hourChar==LOW_K) {
                    dayPeriodLen = 0;
                }
                while (dayPeriodLen-- > 0) {
                    patternFormMapped.append(dayPeriodChar);
                }
                while (hourLen-- > 0) {
                    patternFormMapped.append(hourChar);
                }
            } else if (patChr == CAP_J) {
                // Get pattern for skeleton with H, then replace H or k
                // with fDefaultHourFormatChar (if different)
                patternFormMapped.append(CAP_H);
                *flags |= kDTPGSkeletonUsesCapJ;
            } else {
                patternFormMapped.append(patChr);
            }
        }
    }
    return patternFormMapped;
}